

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

int run_test_suite(TestSuite *suite,TestReporter *reporter)

{
  uint uVar1;
  char *pcVar2;
  
  pcVar2 = getenv("CGREEN_PER_TEST_TIMEOUT");
  if (pcVar2 != (char *)0x0) {
    validate_per_test_timeout_value();
  }
  setup_reporting(reporter);
  run_every_test(suite,reporter);
  uVar1 = 1;
  if (reporter->total_failures == 0) {
    uVar1 = (uint)(reporter->total_exceptions != 0);
  }
  return uVar1;
}

Assistant:

int run_test_suite(TestSuite *suite, TestReporter *reporter)
{
    int success;
    if (per_test_timeout_defined())
    {
        validate_per_test_timeout_value();
    }

    setup_reporting(reporter);
    run_every_test(suite, reporter);
    success = (reporter->total_failures == 0) && (reporter->total_exceptions == 0);
    return success ? EXIT_SUCCESS : EXIT_FAILURE;
}